

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::
run_default_dispatcher_and_go_further(mt_env_infrastructure_t *this,env_init_t *init_fn)

{
  dispatcher_t *pdVar1;
  mt_env_infrastructure_t *this_00;
  _Any_data local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [112];
  mt_env_infrastructure_t *local_58;
  _Any_data local_50;
  code *local_40;
  
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"run_default_dispatcher","");
  local_58 = this;
  std::function<void_()>::function((function<void_()> *)&local_50,init_fn);
  pdVar1 = (this->m_default_dispatcher)._M_t.
           super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
           super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
           super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  local_128 = 0x41464544;
  local_138._8_8_ = 7;
  uStack_124 = 0x544c55;
  local_138._M_unused._M_object = &local_128;
  (*pdVar1->_vptr_dispatcher_t[5])(pdVar1,&local_138);
  if ((undefined4 *)local_138._M_unused._0_8_ != &local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  pdVar1 = (this->m_default_dispatcher)._M_t.
           super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
           super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
           super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  (*pdVar1->_vptr_dispatcher_t[2])(pdVar1,this->m_env);
  this_00 = local_58;
  std::function<void_()>::function((function<void_()> *)&local_138,(function<void_()> *)&local_50);
  run_timer_thread_and_go_further(this_00,(env_init_t *)&local_138);
  if ((code *)CONCAT44(uStack_124,local_128) != (code *)0x0) {
    (*(code *)CONCAT44(uStack_124,local_128))(&local_138,&local_138,3);
  }
  (*((this->m_default_dispatcher)._M_t.
     super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
     super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
     super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl)->_vptr_dispatcher_t[3])();
  (*((this->m_default_dispatcher)._M_t.
     super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
     super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
     super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl)->_vptr_dispatcher_t[4])();
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return;
}

Assistant:

void
mt_env_infrastructure_t::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_dispatcher->set_data_sources_name_base( "DEFAULT" );
					m_default_dispatcher->start( m_env );
				},
				[this] {
					m_default_dispatcher->shutdown();
					m_default_dispatcher->wait();
				},
				[this, init_fn] {
					run_timer_thread_and_go_further( std::move(init_fn) );
				} );
	}